

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

_Bool object_curses_find_element(player *p,object *obj,wchar_t elem)

{
  byte bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t i;
  ulong uVar5;
  long lVar6;
  char o_name [80];
  size_t sVar4;
  
  sVar4 = object_desc(o_name,0x50,obj,0,p);
  bVar1 = (byte)sVar4;
  if (obj->curses != (curse_data *)0x0) {
    lVar6 = 10;
    for (uVar5 = 1; bVar1 = z_info->curse_max, uVar5 < bVar1; uVar5 = uVar5 + 1) {
      wVar2 = rune_index(5,(wchar_t)uVar5);
      if (((obj->curses[uVar5].power != L'\0') &&
          (*(long *)(curses->conflict_flags + lVar6 * 8 + -0x28) != 0)) &&
         (*(short *)(*(long *)(curses->conflict_flags + lVar6 * 8 + -0x28) + 0x74 + (long)elem * 4)
          != 100)) {
        if (p->obj_k->el_info[elem].res_level == 0) {
          msg("Your %s glows.",o_name);
          wVar3 = rune_index(2,elem);
          player_learn_rune(p,(long)wVar3,true);
        }
        if (L'\xffffffff' < wVar2) {
          player_learn_rune(p,(ulong)(uint)wVar2,true);
        }
      }
      lVar6 = lVar6 + 7;
    }
  }
  return (_Bool)bVar1;
}

Assistant:

static bool object_curses_find_element(struct player *p, struct object *obj, int elem)
{
	char o_name[80];
	bool new = false;

	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, p);
	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; i++) {
			int index = rune_index(RUNE_VAR_CURSE, i);

			if (!obj->curses[i].power || !curses[i].obj)
				continue;

			/* Does the object affect the player's resistance to the element? */
			if (curses[i].obj->el_info[elem].res_level != RES_LEVEL_BASE) {
				/* Learn the element properties if we don't know yet */
				if (!p->obj_k->el_info[elem].res_level) {
					msg("Your %s glows.", o_name);

					player_learn_rune(p, rune_index(RUNE_VAR_RESIST, elem),
									  true);
				}

				/* Learn the curse */
				if (index >= 0) {
					player_learn_rune(p, index, true);
				}
				new = true;
			}
		}
	}
	return new;
}